

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fitscore.c
# Opt level: O2

void ffcmps(char *templt,char *colname,int casesen,int *match,int *exact)

{
  int iVar1;
  size_t sVar2;
  ulong uVar3;
  ushort **ppuVar4;
  uint uVar5;
  ulong uVar6;
  char *pcVar7;
  char cVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  bool bVar13;
  char temp [71];
  char col [71];
  
  *match = 0;
  *exact = 1;
  strncpy(temp,templt,0x47);
  strncpy(col,colname,0x47);
  temp[0x46] = '\0';
  col[0x46] = '\0';
  sVar2 = strlen(temp);
  uVar3 = sVar2 & 0xffffffff;
  while( true ) {
    uVar3 = uVar3 - 1;
    if (((int)(uint)uVar3 < 0) || (uVar5 = (uint)uVar3 & 0x7fffffff, temp[uVar5] != ' ')) break;
    temp[uVar5] = '\0';
  }
  sVar2 = strlen(col);
  uVar3 = sVar2 & 0xffffffff;
  while( true ) {
    uVar3 = uVar3 - 1;
    if (((int)(uint)uVar3 < 0) || (uVar5 = (uint)uVar3 & 0x7fffffff, col[uVar5] != ' ')) break;
    col[uVar5] = '\0';
  }
  if (casesen == 0) {
    ffupch(temp);
    ffupch(col);
  }
  if ((temp[0] == col[0]) && (iVar1 = strcmp(temp,col), iVar1 == 0)) {
LAB_001781cf:
    *match = 1;
    return;
  }
  *exact = 0;
  iVar11 = 0;
  iVar12 = 0;
  bVar13 = false;
  iVar9 = 0;
  iVar1 = 0;
  do {
    uVar3 = (ulong)iVar12;
    cVar8 = col[uVar3];
    if (temp[0] == '\0') {
      if (cVar8 == '\0') goto LAB_001781cf;
      if (!bVar13) {
        return;
      }
      temp[0] = temp[iVar9];
      cVar8 = col[(long)iVar1 + 1];
      uVar3 = (long)iVar1 + 1;
      iVar12 = (int)uVar3;
      iVar10 = iVar9;
    }
    else {
      iVar10 = iVar11;
      if (cVar8 == '\0') {
        if (temp[0] != '*') {
          return;
        }
        if (temp[(long)iVar11 + 1] != '\0') {
          return;
        }
        goto LAB_001781cf;
      }
    }
    if ((temp[0] == '?') || (temp[0] == cVar8)) {
      iVar11 = iVar10 + 1;
      uVar3 = (ulong)(iVar12 + 1);
    }
    else if (temp[0] == '*') {
      if ((temp[(long)iVar10 + 1] & 0xdfU) == 0) goto LAB_001781cf;
      uVar6 = (long)iVar10 + 1;
      bVar13 = false;
      while ((iVar11 = (int)uVar6, cVar8 != '\0' && (!bVar13))) {
        bVar13 = temp[iVar11] == cVar8;
        uVar6 = (ulong)(iVar11 + (uint)bVar13);
        cVar8 = col[uVar3 + 1];
        uVar3 = uVar3 + 1;
      }
      if (!bVar13) {
        return;
      }
      bVar13 = true;
      iVar1 = iVar12;
      iVar9 = iVar10;
    }
    else {
      if (temp[0] == '#') {
        ppuVar4 = __ctype_b_loc();
        if ((*(byte *)((long)*ppuVar4 + (long)cVar8 * 2 + 1) & 8) != 0) {
          pcVar7 = col + uVar3 + 1;
          do {
            cVar8 = *pcVar7;
            uVar3 = (ulong)((int)uVar3 + 1);
            pcVar7 = pcVar7 + 1;
          } while ((*(byte *)((long)*ppuVar4 + (long)cVar8 * 2 + 1) & 8) != 0);
          iVar11 = iVar10 + 1;
          goto LAB_001781a7;
        }
      }
      if (!bVar13) {
        return;
      }
      uVar3 = (ulong)(iVar1 + 1);
      bVar13 = true;
      iVar11 = iVar9;
    }
LAB_001781a7:
    temp[0] = temp[iVar11];
    iVar12 = (int)uVar3;
  } while( true );
}

Assistant:

void ffcmps(char *templt,   /* I - input template (may have wildcards)      */
            char *colname,  /* I - full column name up to 68 + 1 chars long */
            int  casesen,   /* I - case sensitive string comparison? 1=yes  */
            int  *match,    /* O - do template and colname match? 1=yes     */
            int  *exact)    /* O - do strings exactly match, or wildcards   */
/*
  compare the template to the string and test if they match.
  The strings are limited to 68 characters or less (the max. length
  of a FITS string keyword value.  This routine reports whether
  the two strings match and whether the match is exact or
  involves wildcards.

  This algorithm is very similar to the way unix filename wildcards
  work except that this first treats a wild card as a literal character
  when looking for a match.  If there is no literal match, then
  it interpretes it as a wild card.  So the template 'AB*DE'
  is considered to be an exact rather than a wild card match to
  the string 'AB*DE'.  The '#' wild card in the template string will 
  match any consecutive string of decimal digits in the colname.
  
*/
{
    int ii, found, t1, s1, wildsearch = 0, tsave = 0, ssave = 0;
    char temp[FLEN_VALUE], col[FLEN_VALUE];

    *match = FALSE;
    *exact = TRUE;

    strncpy(temp, templt, FLEN_VALUE); /* copy strings to work area */
    strncpy(col, colname, FLEN_VALUE);
    temp[FLEN_VALUE - 1] = '\0';  /* make sure strings are terminated */
    col[FLEN_VALUE - 1]  = '\0';

    /* truncate trailing non-significant blanks */
    for (ii = strlen(temp) - 1; ii >= 0 && temp[ii] == ' '; ii--)
        temp[ii] = '\0';

    for (ii = strlen(col) - 1; ii >= 0 && col[ii] == ' '; ii--)
        col[ii] = '\0';
       
    if (!casesen)
    {             /* convert both strings to uppercase before comparison */
        ffupch(temp);
        ffupch(col);
    }

    if (!FSTRCMP(temp, col) )
    {
        *match = TRUE;     /* strings exactly match */
        return;
    }

    *exact = FALSE;    /* strings don't exactly match */

    t1 = 0;   /* start comparison with 1st char of each string */
    s1 = 0;

    while(1)  /* compare corresponding chars in each string */
    {
      if (temp[t1] == '\0' && col[s1] == '\0')
      { 
         /* completely scanned both strings so they match */
         *match = TRUE;
         return;
      }
      else if (temp[t1] == '\0')
      { 
        if (wildsearch)
        {
            /* 
               the previous wildcard search may have been going down
               a blind alley.  Backtrack, and resume the wildcard
               search with the next character in the string.
            */
            t1 = tsave;
            s1 = ssave + 1;
        }
        else
        {
            /* reached end of template string so they don't match */
            return;
        }
      }
      else if (col[s1] == '\0')
      { 
         /* reached end of other string; they match if the next */
         /* character in the template string is a '*' wild card */

        if (temp[t1] == '*' && temp[t1 + 1] == '\0')
        {
           *match = TRUE;
        }

        return;
      }

      if (temp[t1] == col[s1] || (temp[t1] == '?') )
      {
        s1++;  /* corresponding chars in the 2 strings match */
        t1++;  /* increment both pointers and loop back again */
      }
      else if (temp[t1] == '#' && isdigit((int) col[s1]) )
      {
        s1++;  /* corresponding chars in the 2 strings match */
        t1++;  /* increment both pointers */

        /* find the end of the string of digits */
        while (isdigit((int) col[s1]) ) 
            s1++;        
      }
      else if (temp[t1] == '*')
      {

        /* save current string locations, in case we need to restart */
        wildsearch = 1;
        tsave = t1;
        ssave = s1;

        /* get next char from template and look for it in the col name */
        t1++;
        if (temp[t1] == '\0' || temp[t1] == ' ')
        {
          /* reached end of template so strings match */
          *match = TRUE;
          return;
        }

        found = FALSE;
        while (col[s1] && !found)
        {
          if (temp[t1] == col[s1])
          {
            t1++;  /* found matching characters; incre both pointers */
            s1++;  /* and loop back to compare next chars */
            found = TRUE;
          }
          else
            s1++;  /* increment the column name pointer and try again */
        }

        if (!found)
        {
          return;  /* hit end of column name and failed to find a match */
        }
      }
      else
      {
        if (wildsearch)
        {
            /* 
               the previous wildcard search may have been going down
               a blind alley.  Backtrack, and resume the wildcard
               search with the next character in the string.
            */
            t1 = tsave;
            s1 = ssave + 1;
        }
        else
        {
          return;   /* strings don't match */
        }
      }
    }
}